

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-arch.cpp
# Opt level: O3

string * __thiscall LLM_TN_IMPL::str_abi_cxx11_(string *__return_storage_ptr__,LLM_TN_IMPL *this)

{
  llm_tensor lVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  mapped_type *ppcVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  pmVar2 = std::
           map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
           ::at(&LLM_TENSOR_NAMES,&this->arch);
  p_Var3 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    lVar1 = this->tensor;
    p_Var5 = p_Var6;
    do {
      if ((int)lVar1 <= (int)p_Var3[1]._M_color) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < (int)lVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((p_Var5 != p_Var6) && ((int)p_Var5[1]._M_color <= (int)lVar1)) {
      p_Var6 = p_Var5;
    }
  }
  pmVar2 = std::
           map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
           ::at(&LLM_TENSOR_NAMES,&this->arch);
  if ((_Rb_tree_header *)p_Var6 == &(pmVar2->_M_t)._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"__missing__","");
  }
  else {
    pmVar2 = std::
             map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
             ::at(&LLM_TENSOR_NAMES,&this->arch);
    ppcVar4 = std::
              map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
              ::at(pmVar2,&this->tensor);
    format_abi_cxx11_(__return_storage_ptr__,*ppcVar4,(ulong)(uint)this->bid,(ulong)(uint)this->xid)
    ;
    if (this->suffix != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LLM_TN_IMPL::str() const {
    if (LLM_TENSOR_NAMES.at(arch).find(tensor) == LLM_TENSOR_NAMES.at(arch).end()) {
        return "__missing__";
    }

    std::string name = ::format(LLM_TENSOR_NAMES.at(arch).at(tensor), bid, xid);

    if (suffix != nullptr) {
        name += ".";
        name += suffix;
    }

    return name;
}